

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall HEkk::invalidateBasisArtifacts(HEkk *this)

{
  pointer pdVar1;
  
  (this->status_).has_ar_matrix = false;
  (this->status_).has_dual_steepest_edge_weights = false;
  (this->status_).has_invert = false;
  (this->status_).has_fresh_invert = false;
  (this->status_).has_fresh_rebuild = false;
  (this->status_).has_dual_objective_value = false;
  (this->status_).has_primal_objective_value = false;
  (this->dual_ray_record_).index = -1;
  (this->dual_ray_record_).sign = 0;
  pdVar1 = (this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  (this->primal_ray_record_).index = -1;
  (this->primal_ray_record_).sign = 0;
  pdVar1 = (this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  return;
}

Assistant:

void HEkk::invalidateBasisArtifacts() {
  // Invalidate the artifacts of the basis of the simplex LP
  this->status_.has_ar_matrix = false;
  this->status_.has_dual_steepest_edge_weights = false;
  this->status_.has_invert = false;
  this->status_.has_fresh_invert = false;
  this->status_.has_fresh_rebuild = false;
  this->status_.has_dual_objective_value = false;
  this->status_.has_primal_objective_value = false;
  this->clearRayRecords();
}